

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void savegame(memfile *mf)

{
  xchar xVar1;
  char local_15;
  int local_14;
  xchar ltmp;
  int count;
  memfile *mf_local;
  
  local_14 = 0;
  store_version(mf);
  save_flags(mf);
  save_you(mf,&u);
  mwrite32(mf,moves);
  save_mon(mf,&youmonst);
  save_dungeon(mf);
  savelevchn(mf);
  mtag(mf,0,MTAG_LEVELS);
  for (local_15 = '\x01'; xVar1 = maxledgerno(), local_15 <= xVar1; local_15 = local_15 + '\x01') {
    if (levels[local_15] != (level *)0x0) {
      local_14 = local_14 + 1;
    }
  }
  mwrite32(mf,local_14);
  for (local_15 = '\x01'; xVar1 = maxledgerno(), local_15 <= xVar1; local_15 = local_15 + '\x01') {
    if (levels[local_15] != (level *)0x0) {
      mtag(mf,(long)local_15,MTAG_LEVELS);
      mwrite8(mf,local_15);
      savelev(mf,local_15);
    }
  }
  savegamestate(mf);
  return;
}

Assistant:

void savegame(struct memfile *mf)
{
	int count = 0;
	xchar ltmp;

	/* no tag useful here as store_version adds one */
	store_version(mf);

	/* Place flags, player info & moves at the beginning of the save.
	 * This makes it possible to read them in nh_get_savegame_status without
	 * parsing all the dungeon and level data */
	save_flags(mf);
	save_you(mf, &u);
	mwrite32(mf, moves); /* no tag useful here; you is fixed-length */
	save_mon(mf, &youmonst);

	/* store dungeon layout */
	save_dungeon(mf);
	savelevchn(mf);

	/* store levels */
	mtag(mf, 0, MTAG_LEVELS);
	for (ltmp = 1; ltmp <= maxledgerno(); ltmp++)
	    if (levels[ltmp])
		count++;
	mwrite32(mf, count);
	for (ltmp = 1; ltmp <= maxledgerno(); ltmp++) {
		if (!levels[ltmp])
		    continue;
		mtag(mf, ltmp, MTAG_LEVELS);
		mwrite8(mf, ltmp); /* level number*/
		savelev(mf, ltmp); /* actual level*/
	}
	savegamestate(mf);
}